

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnownSystemName.cpp
# Opt level: O3

string_view slang::parsing::toString(KnownSystemName ksn)

{
  string_view sVar1;
  
  if (ksn < (RandMode|Typename)) {
    sVar1._M_str = &DAT_00284548 + *(int *)(&DAT_00284548 + (ulong)ksn * 4);
    sVar1._M_len = *(size_t *)(&DAT_002849c0 + (ulong)ksn * 8);
    return sVar1;
  }
  return (string_view)(ZEXT816(0x286e98) << 0x40);
}

Assistant:

std::string_view toString(KnownSystemName ksn) {
    switch (ksn) {
        case KnownSystemName::Unknown: return "Unknown";
        case KnownSystemName::Bits: return "$bits";
        case KnownSystemName::Typename: return "$typename";
        case KnownSystemName::IsUnbounded: return "$isunbounded";
        case KnownSystemName::Low: return "$low";
        case KnownSystemName::High: return "$high";
        case KnownSystemName::Left: return "$left";
        case KnownSystemName::Right: return "$right";
        case KnownSystemName::Size: return "$size";
        case KnownSystemName::Increment: return "$increment";
        case KnownSystemName::Dimensions: return "$dimensions";
        case KnownSystemName::UnpackedDimensions: return "$unpacked_dimensions";
        case KnownSystemName::Rtoi: return "$rtoi";
        case KnownSystemName::Itor: return "$itor";
        case KnownSystemName::RealToBits: return "$realtobits";
        case KnownSystemName::BitsToReal: return "$bitstoreal";
        case KnownSystemName::ShortrealToBits: return "$shortrealtobits";
        case KnownSystemName::BitsToShortreal: return "$bitstoshortreal";
        case KnownSystemName::Signed: return "$signed";
        case KnownSystemName::Unsigned: return "$unsigned";
        case KnownSystemName::CoverageControl: return "$coverage_control";
        case KnownSystemName::CoverageGetMax: return "$coverage_get_max";
        case KnownSystemName::CoverageGet: return "$coverage_get";
        case KnownSystemName::CoverageMerge: return "$coverage_merge";
        case KnownSystemName::CoverageSave: return "$coverage_save";
        case KnownSystemName::GetCoverage: return "$get_coverage";
        case KnownSystemName::SetCoverageDbName: return "$set_coverage_db_name";
        case KnownSystemName::LoadCoverageDb: return "$load_coverage_db";
        case KnownSystemName::Clog2: return "$clog2";
        case KnownSystemName::CountBits: return "$countbits";
        case KnownSystemName::CountOnes: return "$countones";
        case KnownSystemName::OneHot: return "$onehot";
        case KnownSystemName::OneHot0: return "$onehot0";
        case KnownSystemName::IsUnknown: return "$isunknown";
        case KnownSystemName::Ln: return "$ln";
        case KnownSystemName::Log10: return "$log10";
        case KnownSystemName::Exp: return "$exp";
        case KnownSystemName::Sqrt: return "$sqrt";
        case KnownSystemName::Floor: return "$floor";
        case KnownSystemName::Ceil: return "$ceil";
        case KnownSystemName::Sin: return "$sin";
        case KnownSystemName::Cos: return "$cos";
        case KnownSystemName::Tan: return "$tan";
        case KnownSystemName::Asin: return "$asin";
        case KnownSystemName::Acos: return "$acos";
        case KnownSystemName::Atan: return "$atan";
        case KnownSystemName::Sinh: return "$sinh";
        case KnownSystemName::Cosh: return "$cosh";
        case KnownSystemName::Tanh: return "$tanh";
        case KnownSystemName::Asinh: return "$asinh";
        case KnownSystemName::Acosh: return "$acosh";
        case KnownSystemName::Atanh: return "$atanh";
        case KnownSystemName::Pow: return "$pow";
        case KnownSystemName::Atan2: return "$atan2";
        case KnownSystemName::Hypot: return "$hypot";
        case KnownSystemName::ValuePlusArgs: return "$value$plusargs";
        case KnownSystemName::GlobalClock: return "$global_clock";
        case KnownSystemName::SFormatF: return "$sformatf";
        case KnownSystemName::PSPrintF: return "$psprintf";
        case KnownSystemName::InferredClock: return "$inferred_clock";
        case KnownSystemName::InferredDisable: return "$inferred_disable";
        case KnownSystemName::Randomize: return "randomize";
        case KnownSystemName::Triggered: return "triggered";
        case KnownSystemName::Matched: return "matched";
        case KnownSystemName::FError: return "$ferror";
        case KnownSystemName::FGets: return "$fgets";
        case KnownSystemName::FScanf: return "$fscanf";
        case KnownSystemName::SScanf: return "$sscanf";
        case KnownSystemName::FRead: return "$fread";
        case KnownSystemName::FOpen: return "$fopen";
        case KnownSystemName::FClose: return "$fclose";
        case KnownSystemName::FGetC: return "$fgetc";
        case KnownSystemName::UngetC: return "$ungetc";
        case KnownSystemName::FTell: return "$ftell";
        case KnownSystemName::FSeek: return "$fseek";
        case KnownSystemName::Rewind: return "$rewind";
        case KnownSystemName::FFlush: return "$fflush";
        case KnownSystemName::FEof: return "$feof";
        case KnownSystemName::Rose: return "$rose";
        case KnownSystemName::Fell: return "$fell";
        case KnownSystemName::Stable: return "$stable";
        case KnownSystemName::Changed: return "$changed";
        case KnownSystemName::PastGclk: return "$past_gclk";
        case KnownSystemName::RoseGclk: return "$rose_gclk";
        case KnownSystemName::FellGclk: return "$fell_gclk";
        case KnownSystemName::StableGclk: return "$stable_gclk";
        case KnownSystemName::ChangedGclk: return "$changed_gclk";
        case KnownSystemName::FutureGclk: return "$future_gclk";
        case KnownSystemName::RisingGclk: return "$rising_gclk";
        case KnownSystemName::FallingGclk: return "$falling_gclk";
        case KnownSystemName::SteadyGclk: return "$steady_gclk";
        case KnownSystemName::ChangingGclk: return "$changing_gclk";
        case KnownSystemName::Sampled: return "$sampled";
        case KnownSystemName::Past: return "$past";
        case KnownSystemName::Stacktrace: return "$stacktrace";
        case KnownSystemName::CountDrivers: return "$countdrivers";
        case KnownSystemName::GetPattern: return "$getpattern";
        case KnownSystemName::TestPlusArgs: return "$test$plusargs";
        case KnownSystemName::Time: return "$time";
        case KnownSystemName::STime: return "$stime";
        case KnownSystemName::RealTime: return "$realtime";
        case KnownSystemName::Random: return "$random";
        case KnownSystemName::URandom: return "$urandom";
        case KnownSystemName::URandomRange: return "$urandom_range";
        case KnownSystemName::ResetCount: return "$reset_count";
        case KnownSystemName::ResetValue: return "$reset_value";
        case KnownSystemName::TimeUnit: return "$timeunit";
        case KnownSystemName::TimePrecision: return "$timeprecision";
        case KnownSystemName::Scale: return "$scale";
        case KnownSystemName::SdfAnnotate: return "$sdf_annotate";
        case KnownSystemName::DistUniform: return "$dist_uniform";
        case KnownSystemName::DistNormal: return "$dist_normal";
        case KnownSystemName::DistExponential: return "$dist_exponential";
        case KnownSystemName::DistPoisson: return "$dist_poisson";
        case KnownSystemName::DistChiSquare: return "$dist_chi_square";
        case KnownSystemName::DistT: return "$dist_t";
        case KnownSystemName::DistErlang: return "$dist_erlang";
        case KnownSystemName::Fatal: return "$fatal";
        case KnownSystemName::StaticAssert: return "$static_assert";
        case KnownSystemName::Cast: return "$cast";
        case KnownSystemName::Info: return "$info";
        case KnownSystemName::Warning: return "$warning";
        case KnownSystemName::Error: return "$error";
        case KnownSystemName::Finish: return "$finish";
        case KnownSystemName::Stop: return "$stop";
        case KnownSystemName::AssertControl: return "$assertcontrol";
        case KnownSystemName::AssertOn: return "$asserton";
        case KnownSystemName::AssertOff: return "$assertoff";
        case KnownSystemName::AssertKill: return "$assertkill";
        case KnownSystemName::AssertPassOn: return "$assertpasson";
        case KnownSystemName::AssertPassOff: return "$assertpassoff";
        case KnownSystemName::AssertFailOn: return "$assertfailon";
        case KnownSystemName::AssertFailOff: return "$assertfailoff";
        case KnownSystemName::AssertNonvacuousOn: return "$assertnonvacuouson";
        case KnownSystemName::AssertVacuousOff: return "$assertvacuousoff";
        case KnownSystemName::Display: return "$display";
        case KnownSystemName::DisplayB: return "$displayb";
        case KnownSystemName::DisplayO: return "$displayo";
        case KnownSystemName::DisplayH: return "$displayh";
        case KnownSystemName::Write: return "$write";
        case KnownSystemName::WriteB: return "$writeb";
        case KnownSystemName::WriteO: return "$writeo";
        case KnownSystemName::WriteH: return "$writeh";
        case KnownSystemName::Strobe: return "$strobe";
        case KnownSystemName::StrobeB: return "$strobeb";
        case KnownSystemName::StrobeO: return "$strobeo";
        case KnownSystemName::StrobeH: return "$strobeh";
        case KnownSystemName::Monitor: return "$monitor";
        case KnownSystemName::MonitorB: return "$monitorb";
        case KnownSystemName::MonitorO: return "$monitoro";
        case KnownSystemName::MonitorH: return "$monitorh";
        case KnownSystemName::FDisplay: return "$fdisplay";
        case KnownSystemName::FDisplayB: return "$fdisplayb";
        case KnownSystemName::FDisplayO: return "$fdisplayo";
        case KnownSystemName::FDisplayH: return "$fdisplayh";
        case KnownSystemName::FWrite: return "$fwrite";
        case KnownSystemName::FWriteB: return "$fwriteb";
        case KnownSystemName::FWriteO: return "$fwriteo";
        case KnownSystemName::FWriteH: return "$fwriteh";
        case KnownSystemName::FStrobe: return "$fstrobe";
        case KnownSystemName::FStrobeB: return "$fstrobeb";
        case KnownSystemName::FStrobeO: return "$fstrobeo";
        case KnownSystemName::FStrobeH: return "$fstrobeh";
        case KnownSystemName::FMonitor: return "$fmonitor";
        case KnownSystemName::FMonitorB: return "$fmonitorb";
        case KnownSystemName::FMonitorO: return "$fmonitoro";
        case KnownSystemName::FMonitorH: return "$fmonitorh";
        case KnownSystemName::SWrite: return "$swrite";
        case KnownSystemName::SWriteB: return "$swriteb";
        case KnownSystemName::SWriteO: return "$swriteo";
        case KnownSystemName::SWriteH: return "$swriteh";
        case KnownSystemName::SFormat: return "$sformat";
        case KnownSystemName::PrintTimeScale: return "$printtimescale";
        case KnownSystemName::DumpVars: return "$dumpvars";
        case KnownSystemName::DumpPorts: return "$dumpports";
        case KnownSystemName::ShowVars: return "$showvars";
        case KnownSystemName::ReadMemB: return "$readmemb";
        case KnownSystemName::ReadMemH: return "$readmemh";
        case KnownSystemName::WriteMemB: return "$writememb";
        case KnownSystemName::WriteMemH: return "$writememh";
        case KnownSystemName::SReadMemB: return "$sreadmemb";
        case KnownSystemName::SReadMemH: return "$sreadmemh";
        case KnownSystemName::System: return "$system";
        case KnownSystemName::List: return "$list";
        case KnownSystemName::Scope: return "$scope";
        case KnownSystemName::Exit: return "$exit";
        case KnownSystemName::TimeFormat: return "$timeformat";
        case KnownSystemName::MonitorOn: return "$monitoron";
        case KnownSystemName::MonitorOff: return "$monitoroff";
        case KnownSystemName::DumpFile: return "$dumpfile";
        case KnownSystemName::DumpOn: return "$dumpon";
        case KnownSystemName::DumpOff: return "$dumpoff";
        case KnownSystemName::DumpAll: return "$dumpall";
        case KnownSystemName::DumpLimit: return "$dumplimit";
        case KnownSystemName::DumpFlush: return "$dumpflush";
        case KnownSystemName::DumpPortsOn: return "$dumpportson";
        case KnownSystemName::DumpPortsOff: return "$dumpportsoff";
        case KnownSystemName::DumpPortsAll: return "$dumpportsall";
        case KnownSystemName::DumpPortsLimit: return "$dumpportslimit";
        case KnownSystemName::DumpPortsFlush: return "$dumpportsflush";
        case KnownSystemName::Input: return "$input";
        case KnownSystemName::Key: return "$key";
        case KnownSystemName::NoKey: return "$nokey";
        case KnownSystemName::Log: return "$log";
        case KnownSystemName::NoLog: return "$nolog";
        case KnownSystemName::Reset: return "$reset";
        case KnownSystemName::Save: return "$save";
        case KnownSystemName::Restart: return "$restart";
        case KnownSystemName::IncSave: return "$incsave";
        case KnownSystemName::ShowScopes: return "$showscopes";
        case KnownSystemName::QInitialize: return "$q_initialize";
        case KnownSystemName::QAdd: return "$q_add";
        case KnownSystemName::QRemove: return "$q_remove";
        case KnownSystemName::QExam: return "$q_exam";
        case KnownSystemName::QFull: return "$q_full";
        case KnownSystemName::AsyncAndArray: return "$async$and$array";
        case KnownSystemName::SyncAndArray: return "$sync$and$array";
        case KnownSystemName::AsyncAndPlane: return "$async$and$plane";
        case KnownSystemName::SyncAndPlane: return "$sync$and$plane";
        case KnownSystemName::AsyncNandArray: return "$async$nand$array";
        case KnownSystemName::SyncNandArray: return "$sync$nand$array";
        case KnownSystemName::AsyncNandPlane: return "$async$nand$plane";
        case KnownSystemName::SyncNandPlane: return "$sync$nand$plane";
        case KnownSystemName::AsyncOrArray: return "$async$or$array";
        case KnownSystemName::SyncOrArray: return "$sync$or$array";
        case KnownSystemName::AsyncOrPlane: return "$async$or$plane";
        case KnownSystemName::SyncOrPlane: return "$sync$or$plane";
        case KnownSystemName::AsyncNorArray: return "$async$nor$array";
        case KnownSystemName::SyncNorArray: return "$sync$nor$array";
        case KnownSystemName::AsyncNorPlane: return "$async$nor$plane";
        case KnownSystemName::SyncNorPlane: return "$sync$nor$plane";
        case KnownSystemName::Reverse: return "reverse";
        case KnownSystemName::Delete: return "delete";
        case KnownSystemName::Exists: return "exists";
        case KnownSystemName::Insert: return "insert";
        case KnownSystemName::Index: return "index";
        case KnownSystemName::Map: return "map";
        case KnownSystemName::ArraySize: return "size";
        case KnownSystemName::Or: return "or";
        case KnownSystemName::And: return "and";
        case KnownSystemName::XOr: return "xor";
        case KnownSystemName::Sum: return "sum";
        case KnownSystemName::Product: return "product";
        case KnownSystemName::Find: return "find";
        case KnownSystemName::FindIndex: return "find_index";
        case KnownSystemName::FindFirst: return "find_first";
        case KnownSystemName::FindFirstIndex: return "find_first_index";
        case KnownSystemName::FindLast: return "find_last";
        case KnownSystemName::FindLastIndex: return "find_last_index";
        case KnownSystemName::Min: return "min";
        case KnownSystemName::Max: return "max";
        case KnownSystemName::Unique: return "unique";
        case KnownSystemName::UniqueIndex: return "unique_index";
        case KnownSystemName::Sort: return "sort";
        case KnownSystemName::Rsort: return "rsort";
        case KnownSystemName::Shuffle: return "shuffle";
        case KnownSystemName::Num: return "num";
        case KnownSystemName::First: return "first";
        case KnownSystemName::Last: return "last";
        case KnownSystemName::Next: return "next";
        case KnownSystemName::Prev: return "prev";
        case KnownSystemName::PopFront: return "pop_front";
        case KnownSystemName::PopBack: return "pop_back";
        case KnownSystemName::PushFront: return "push_front";
        case KnownSystemName::PushBack: return "push_back";
        case KnownSystemName::Name: return "name";
        case KnownSystemName::Len: return "len";
        case KnownSystemName::Putc: return "putc";
        case KnownSystemName::Getc: return "getc";
        case KnownSystemName::Substr: return "substr";
        case KnownSystemName::ToUpper: return "toupper";
        case KnownSystemName::ToLower: return "tolower";
        case KnownSystemName::Compare: return "compare";
        case KnownSystemName::ICompare: return "icompare";
        case KnownSystemName::AToI: return "atoi";
        case KnownSystemName::AToHex: return "atohex";
        case KnownSystemName::AToOct: return "atooct";
        case KnownSystemName::AToBin: return "atobin";
        case KnownSystemName::AToReal: return "atoreal";
        case KnownSystemName::IToA: return "itoa";
        case KnownSystemName::HexToA: return "hextoa";
        case KnownSystemName::OctToA: return "octtoa";
        case KnownSystemName::BinToA: return "bintoa";
        case KnownSystemName::RealToA: return "realtoa";
        case KnownSystemName::RandMode: return "rand_mode";
        case KnownSystemName::ConstraintMode: return "constraint_mode";
    }
    return "";
}